

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel *self,int new_size,ImDrawChannel *v)

{
  undefined8 *puVar1;
  ImDrawChannel *pIVar2;
  undefined8 uVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  iVar8 = self->Capacity;
  if (iVar8 < new_size) {
    if (iVar8 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar8 / 2 + iVar8;
    }
    if (iVar8 <= new_size) {
      iVar8 = new_size;
    }
    ImVector<ImDrawChannel>::reserve(self,iVar8);
  }
  lVar6 = (long)self->Size;
  if (self->Size < new_size) {
    lVar7 = lVar6 << 5;
    for (; lVar6 < new_size; lVar6 = lVar6 + 1) {
      pIVar2 = self->Data;
      uVar3 = *(undefined8 *)&v->_CmdBuffer;
      pIVar4 = (v->_CmdBuffer).Data;
      puVar5 = (v->_IdxBuffer).Data;
      puVar1 = (undefined8 *)((long)&(pIVar2->_IdxBuffer).Size + lVar7);
      *puVar1 = *(undefined8 *)&v->_IdxBuffer;
      puVar1[1] = puVar5;
      puVar1 = (undefined8 *)((long)&(pIVar2->_CmdBuffer).Size + lVar7);
      *puVar1 = uVar3;
      puVar1[1] = pIVar4;
      lVar7 = lVar7 + 0x20;
    }
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel* self,int new_size,const ImDrawChannel v)
{
    return self->resize(new_size,v);
}